

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_array_extend(json_t *json,json_t *other_json)

{
  json_t **ppjVar1;
  ulong local_38;
  size_t i;
  json_array_t *other;
  json_array_t *array;
  json_t *other_json_local;
  json_t *json_local;
  
  if ((((json == (json_t *)0x0) || (json->type != JSON_ARRAY)) || (other_json == (json_t *)0x0)) ||
     (other_json->type != JSON_ARRAY)) {
    json_local._4_4_ = -1;
  }
  else {
    ppjVar1 = json_array_grow((json_array_t *)json,*(size_t *)(other_json + 4),1);
    if (ppjVar1 == (json_t **)0x0) {
      json_local._4_4_ = -1;
    }
    else {
      for (local_38 = 0; local_38 < *(ulong *)(other_json + 4); local_38 = local_38 + 1) {
        json_incref(*(json_t **)(*(long *)(other_json + 6) + local_38 * 8));
      }
      array_copy(*(json_t ***)(json + 6),*(size_t *)(json + 4),*(json_t ***)(other_json + 6),0,
                 *(size_t *)(other_json + 4));
      *(long *)(json + 4) = *(long *)(other_json + 4) + *(long *)(json + 4);
      json_local._4_4_ = 0;
    }
  }
  return json_local._4_4_;
}

Assistant:

int json_array_extend(json_t *json, json_t *other_json) {
    json_array_t *array, *other;
    size_t i;

    if (!json_is_array(json) || !json_is_array(other_json))
        return -1;
    array = json_to_array(json);
    other = json_to_array(other_json);

    if (!json_array_grow(array, other->entries, 1))
        return -1;

    for (i = 0; i < other->entries; i++)
        json_incref(other->table[i]);

    array_copy(array->table, array->entries, other->table, 0, other->entries);

    array->entries += other->entries;
    return 0;
}